

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-reset.c
# Opt level: O2

void do_connect(uv_loop_t *loop,uv_tcp_t *tcp_client)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  sockaddr_in addr;
  sockaddr_in sStack_18;
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_18);
  if (iVar1 == 0) {
    iVar1 = uv_tcp_init(loop,&::tcp_client);
    if (iVar1 == 0) {
      iVar1 = uv_tcp_connect(&connect_req,&::tcp_client,(sockaddr *)&sStack_18,connect_cb);
      if (iVar1 == 0) {
        return;
      }
      pcVar3 = "r == 0";
      uVar2 = 0xb1;
    }
    else {
      pcVar3 = "r == 0";
      uVar2 = 0xab;
    }
  }
  else {
    pcVar3 = "0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)";
    uVar2 = 0xa8;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-close-reset.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

static void do_connect(uv_loop_t* loop, uv_tcp_t* tcp_client) {
  struct sockaddr_in addr;
  int r;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_tcp_init(loop, tcp_client);
  ASSERT(r == 0);

  r = uv_tcp_connect(&connect_req,
                     tcp_client,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  ASSERT(r == 0);
}